

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O1

void divide_nalus(void)

{
  uint8_t *puVar1;
  ulong uVar2;
  ulong uVar3;
  uint64_t uVar4;
  uint32_t uVar5;
  ulong uVar6;
  
  puVar1 = buf;
  uVar2 = buf_size - 6;
  if (buf_size != 6) {
    uVar3 = 0;
    uVar5 = au_pos;
    do {
      uVar4 = uVar3 + 1;
      if (*(int *)(puVar1 + uVar3) == 0x1000000) {
        uVar6 = (ulong)uVar5;
        uVar5 = uVar5 + 1;
        au_pos = uVar5;
        au_buf[uVar6] = uVar4;
        uVar4 = uVar3 + 4;
      }
      uVar3 = uVar4;
    } while (uVar4 < uVar2);
  }
  return;
}

Assistant:

void divide_nalus()
{

    for(uint64_t i = 0; i < buf_size - 6;)
    {
        uint32_t re_buf_cache = *((uint32_t *)(buf + i));
        if(0x01000000 == re_buf_cache)
        {
            au_buf[au_pos++] = i + 1;
            i += 4;
        }
        else
            i++;
    }
}